

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sub_8_re_pi(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in;
  uint value;
  uint uVar4;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in + 1;
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 7 & 0x1c));
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_8(uVar2 & m68ki_cpu.address_mask);
  uVar4 = (uint)bVar1;
  m68ki_cpu.x_flag = uVar3 - uVar4;
  value = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.v_flag = (m68ki_cpu.x_flag ^ uVar3) & (uVar4 ^ uVar3);
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static void m68k_op_sub_8_re_pi(void)
{
	uint ea = EA_AY_PI_8();
	uint src = MASK_OUT_ABOVE_8(DX);
	uint dst = m68ki_read_8(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);

	m68ki_write_8(ea, FLAG_Z);
}